

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

clock_variables_t *
tchecker::clock_variables
          (clock_variables_t *__return_storage_ptr__,reference_clock_variables_t *refclocks,
          clock_variables_t *clocks)

{
  bool bVar1;
  clock_id_t cVar2;
  size_t_conflict size;
  reference_clock_variables_t *name_00;
  reference __in;
  type_conflict *ptVar3;
  type *name_01;
  size_info_t *this;
  int __c;
  type *name;
  type *id_1;
  undefined1 local_50 [8];
  const_key_map_iterator_t __end1;
  const_key_map_iterator_t __begin1;
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  uint local_28;
  clock_id_t id;
  clock_variables_t *clocks_local;
  reference_clock_variables_t *refclocks_local;
  clock_variables_t *clockvars;
  
  name_00 = refclocks;
  clock_variables_t::clock_variables_t(__return_storage_ptr__);
  for (local_28 = 0; cVar2 = reference_clock_variables_t::refcount(refclocks), local_28 < cVar2;
      local_28 = local_28 + 1) {
    name_00 = (reference_clock_variables_t *)
              variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::name((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)refclocks,local_28);
    clock_variables_t::declare(__return_storage_ptr__,(string *)name_00,1);
  }
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::index((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)clocks,(char *)name_00,__c);
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::begin((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&__end1);
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::end((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_50);
  while (bVar1 = boost::container::operator!=
                           (&__end1,(vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
                                     *)local_50), bVar1) {
    __in = boost::container::
           vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
           ::operator*(&__end1);
    ptVar3 = std::get<0ul,unsigned_int,std::__cxx11::string>(__in);
    name_01 = std::get<1ul,unsigned_int,std::__cxx11::string>(__in);
    this = &variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::info((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)clocks,*ptVar3)->super_size_info_t;
    size = size_info_t::size(this);
    clock_variables_t::declare(__return_storage_ptr__,name_01,size);
    boost::container::
    vec_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::clock_variables_t clock_variables(tchecker::reference_clock_variables_t const & refclocks,
                                            tchecker::clock_variables_t const & clocks)
{
  tchecker::clock_variables_t clockvars;

  // declare reference clocks
  for (tchecker::clock_id_t id = 0; id < refclocks.refcount(); ++id)
    clockvars.declare(refclocks.name(id), 1);

  // declare clocks
  for (auto && [id, name] : clocks.index())
    clockvars.declare(name, clocks.info(id).size());

  return clockvars;
}